

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O1

u16 computeNumericType(Mem *pMem)

{
  u16 uVar1;
  int iVar2;
  
  if ((pMem->flags & 0x4000) != 0) {
    sqlite3VdbeMemExpandBlob(pMem);
  }
  iVar2 = sqlite3AtoF(pMem->z,(double *)pMem,pMem->n,pMem->enc);
  if (iVar2 == 0) {
    uVar1 = 0;
  }
  else {
    iVar2 = sqlite3Atoi64(pMem->z,(i64 *)pMem,pMem->n,pMem->enc);
    uVar1 = (ushort)(iVar2 != 0) * 4 + 4;
  }
  return uVar1;
}

Assistant:

static u16 SQLITE_NOINLINE computeNumericType(Mem *pMem){
  assert( (pMem->flags & (MEM_Int|MEM_Real))==0 );
  assert( (pMem->flags & (MEM_Str|MEM_Blob))!=0 );
  ExpandBlob(pMem);
  if( sqlite3AtoF(pMem->z, &pMem->u.r, pMem->n, pMem->enc)==0 ){
    return 0;
  }
  if( sqlite3Atoi64(pMem->z, &pMem->u.i, pMem->n, pMem->enc)==0 ){
    return MEM_Int;
  }
  return MEM_Real;
}